

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcorolib.c
# Opt level: O0

int luaB_close(lua_State *L)

{
  int iVar1;
  lua_State *co_00;
  int status;
  lua_State *co;
  lua_State *L_local;
  
  co_00 = getco(L);
  iVar1 = auxstatus(L,co_00);
  if (iVar1 == 1 || iVar1 == 2) {
    iVar1 = lua_closethread(co_00,L);
    if (iVar1 == 0) {
      lua_pushboolean(L,1);
      L_local._4_4_ = 1;
    }
    else {
      lua_pushboolean(L,0);
      lua_xmove(co_00,L,1);
      L_local._4_4_ = 2;
    }
  }
  else {
    L_local._4_4_ = luaL_error(L,"cannot close a %s coroutine",statname[iVar1]);
  }
  return L_local._4_4_;
}

Assistant:

static int luaB_close (lua_State *L) {
  lua_State *co = getco(L);
  int status = auxstatus(L, co);
  switch (status) {
    case COS_DEAD: case COS_YIELD: {
      status = lua_closethread(co, L);
      if (status == LUA_OK) {
        lua_pushboolean(L, 1);
        return 1;
      }
      else {
        lua_pushboolean(L, 0);
        lua_xmove(co, L, 1);  /* move error message */
        return 2;
      }
    }
    default:  /* normal or running coroutine */
      return luaL_error(L, "cannot close a %s coroutine", statname[status]);
  }
}